

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleLockCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  string *__lhs;
  FILE *__stream;
  cmGlobalGenerator *pcVar7;
  cmFileLockPool *this_00;
  uint uVar8;
  ulong uVar9;
  int local_26c;
  cmFileLockResult fileLockResult;
  string parentDir;
  pointer local_230;
  string path;
  string result;
  string resultVariable;
  ostringstream e;
  string local_50;
  
  resultVariable._M_dataplus._M_p = (pointer)&resultVariable.field_2;
  resultVariable._M_string_length = 0;
  resultVariable.field_2._M_local_buf[0] = '\0';
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"sub-command LOCK requires at least two arguments.",
               (allocator<char> *)&path);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar5 = false;
    goto LAB_001cb96d;
  }
  std::__cxx11::string::string((string *)&path,(string *)(pbVar1 + 1));
  local_230 = (pointer)0xffffffffffffffff;
  bVar5 = false;
  local_26c = 2;
  uVar9 = 2;
  bVar4 = false;
  while( true ) {
    uVar8 = (uint)uVar9;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
    break;
    bVar3 = std::operator==(pbVar1 + uVar9,"DIRECTORY");
    if (bVar3) {
      bVar4 = true;
    }
    else {
      bVar3 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"RELEASE");
      if (bVar3) {
        bVar5 = true;
      }
      else {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"GUARD");
        if (bVar3) {
          uVar8 = uVar8 + 1;
          uVar9 = (ulong)uVar8;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar9) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"expected FUNCTION, FILE or PROCESS after GUARD",
                       (allocator<char> *)&parentDir);
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
LAB_001cb789:
            std::__cxx11::string::~string((string *)&e);
LAB_001cb81b:
            bVar5 = false;
            goto LAB_001cb963;
          }
          bVar3 = std::operator==(pbVar1 + uVar9,"FUNCTION");
          local_26c = 0;
          if (!bVar3) {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILE");
            if (bVar3) {
              local_26c = 1;
            }
            else {
              bVar3 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9,"PROCESS");
              local_26c = 2;
              if (!bVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                poVar6 = std::operator<<((ostream *)&e,
                                         "expected FUNCTION, FILE or PROCESS after GUARD");
                poVar6 = std::operator<<(poVar6,", but got:\n  \"");
                poVar6 = std::operator<<(poVar6,(string *)
                                                ((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + uVar9)
                                        );
                std::operator<<(poVar6,"\".");
                pcVar2 = (this->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
                goto LAB_001cb804;
              }
            }
          }
        }
        else {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                  "RESULT_VARIABLE");
          if (!bVar3) {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,"TIMEOUT");
            if (bVar3) {
              uVar8 = uVar8 + 1;
              uVar9 = (ulong)uVar8;
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
                  uVar9) {
                pcVar2 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,"expected timeout value after TIMEOUT",
                           (allocator<char> *)&parentDir);
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
                goto LAB_001cb789;
              }
              bVar3 = cmSystemTools::StringToLong(pbVar1[uVar9]._M_dataplus._M_p,(long *)&result);
              local_230 = result._M_dataplus._M_p;
              if (bVar3 && -1 < (long)result._M_dataplus._M_p) goto LAB_001cb238;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar6 = std::operator<<((ostream *)&e,"TIMEOUT value \"");
              poVar6 = std::operator<<(poVar6,(string *)
                                              ((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + uVar9));
              std::operator<<(poVar6,"\" is not an unsigned integer.");
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              std::operator<<((ostream *)&e,
                              "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or TIMEOUT\n");
              poVar6 = std::operator<<((ostream *)&e,"but got: \"");
              poVar6 = std::operator<<(poVar6,(string *)
                                              ((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + uVar9));
              std::operator<<(poVar6,"\".");
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
            }
LAB_001cb804:
            std::__cxx11::string::~string((string *)&parentDir);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            goto LAB_001cb81b;
          }
          uVar8 = uVar8 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar8) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"expected variable name after RESULT_VARIABLE",
                       (allocator<char> *)&parentDir);
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
            goto LAB_001cb789;
          }
          std::__cxx11::string::_M_assign((string *)&resultVariable);
        }
      }
    }
LAB_001cb238:
    uVar9 = (ulong)(uVar8 + 1);
  }
  if (bVar4) {
    std::__cxx11::string::append((char *)&path);
  }
  bVar4 = cmsys::SystemTools::FileIsFullPath(&path);
  if (!bVar4) {
    __lhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::operator+(&parentDir,__lhs,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   &parentDir,&path);
    std::__cxx11::string::operator=((string *)&path,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&parentDir);
  }
  cmsys::SystemTools::CollapseFullPath((string *)&e,&path);
  std::__cxx11::string::operator=((string *)&path,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  cmsys::SystemTools::GetParentDirectory(&parentDir,&path);
  bVar4 = cmsys::SystemTools::MakeDirectory(&parentDir,(mode_t *)0x0);
  if (bVar4) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(&path,"w");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"file\n  \"");
      poVar6 = std::operator<<(poVar6,(string *)&path);
      std::operator<<(poVar6,"\"\ncreation failed (check permissions).");
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&result);
      goto LAB_001cb60c;
    }
    fclose(__stream);
    pcVar7 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    fileLockResult = cmFileLockResult::MakeOk();
    this_00 = &pcVar7->FileLockPool;
    if (bVar5) {
      fileLockResult = cmFileLockPool::Release(this_00,&path);
    }
    else if (local_26c == 2) {
      fileLockResult = cmFileLockPool::LockProcessScope(this_00,&path,(unsigned_long)local_230);
    }
    else if (local_26c == 1) {
      fileLockResult = cmFileLockPool::LockFileScope(this_00,&path,(unsigned_long)local_230);
    }
    else {
      fileLockResult = cmFileLockPool::LockFunctionScope(this_00,&path,(unsigned_long)local_230);
    }
    cmFileLockResult::GetOutputMessage_abi_cxx11_(&result,&fileLockResult);
    if (resultVariable._M_string_length == 0) {
      bVar5 = cmFileLockResult::IsOk(&fileLockResult);
      if (bVar5) {
        if (resultVariable._M_string_length != 0) goto LAB_001cb867;
        bVar5 = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar6 = std::operator<<((ostream *)&e,"error locking file\n  \"");
        poVar6 = std::operator<<(poVar6,(string *)&path);
        poVar6 = std::operator<<(poVar6,"\"\n");
        poVar6 = std::operator<<(poVar6,(string *)&result);
        std::operator<<(poVar6,".");
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar5 = false;
      }
    }
    else {
LAB_001cb867:
      bVar5 = true;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&resultVariable,result._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,"directory\n  \"");
    poVar6 = std::operator<<(poVar6,(string *)&parentDir);
    std::operator<<(poVar6,"\"\ncreation failed ");
    std::operator<<((ostream *)&e,"(check permissions).");
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&result);
LAB_001cb60c:
    std::__cxx11::string::~string((string *)&result);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&parentDir);
LAB_001cb963:
  std::__cxx11::string::~string((string *)&path);
LAB_001cb96d:
  std::__cxx11::string::~string((string *)&resultVariable);
  return bVar5;
}

Assistant:

bool cmFileCommand::HandleLockCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        std::ostringstream e;
        e << merr << ", but got:\n  \"" << args[i] << "\".";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmSystemTools::StringToLong(args[i].c_str(), &scanned) ||
          scanned < 0) {
        std::ostringstream e;
        e << "TIMEOUT value \"" << args[i] << "\" is not an unsigned integer.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      std::ostringstream e;
      e << "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or TIMEOUT\n";
      e << "but got: \"" << args[i] << "\".";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  if (!cmsys::SystemTools::FileIsFullPath(path)) {
    path = this->Makefile->GetCurrentSourceDirectory() + "/" + path;
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(path);

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    std::ostringstream e;
    e << "directory\n  \"" << parentDir << "\"\ncreation failed ";
    e << "(check permissions).";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    std::ostringstream e;
    e << "file\n  \"" << path << "\"\ncreation failed (check permissions).";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    this->Makefile->GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccured();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    std::ostringstream e;
    e << "error locking file\n  \"" << path << "\"\n" << result << ".";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (!resultVariable.empty()) {
    this->Makefile->AddDefinition(resultVariable, result.c_str());
  }

  return true;
#else
  static_cast<void>(args);
  this->SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}